

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::UniquenessConstraint::fromSyntax(UniquenessConstraintSyntax *syntax,ASTContext *context)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar1;
  LanguageVersion LVar2;
  Compilation *compilation;
  RangeListSyntax *pRVar3;
  size_t sVar4;
  bool bVar5;
  Type *pTVar6;
  bool bVar7;
  int iVar8;
  RandMode RVar9;
  ExpressionSyntax *pEVar10;
  undefined4 extraout_var;
  Symbol *this_00;
  DeclaredType *pDVar11;
  Type *pTVar12;
  Diagnostic *pDVar13;
  undefined4 extraout_var_00;
  UniquenessConstraint *ctrl;
  iterator *extraout_RDX;
  iterator *extraout_RDX_00;
  iterator *extraout_RDX_01;
  iterator *extraout_RDX_02;
  iterator *extraout_RDX_03;
  iterator *extraout_RDX_04;
  iterator *extraout_RDX_05;
  iterator *extraout_RDX_06;
  iterator *extraout_RDX_07;
  iterator *src;
  DiagCode code;
  UniquenessConstraint *args;
  Type *local_a8;
  iterator __begin2;
  Expression *local_78;
  SmallVector<const_slang::ast::Expression_*,_5UL> items;
  Expression *this;
  
  compilation = ((context->scope).ptr)->compilation;
  LVar2 = (compilation->options).languageVersion;
  items.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)items.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  items.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  items.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  pRVar3 = (syntax->ranges).ptr;
  pSVar1 = &pRVar3->valueRanges;
  src = &__begin2;
  __begin2.index = 0;
  sVar4 = (pRVar3->valueRanges).elements._M_extent._M_extent_value;
  local_a8 = (Type *)0x0;
  bVar5 = false;
  __begin2.list = pSVar1;
  do {
    if ((__begin2.list == pSVar1) && (__begin2.index == sVar4 + 1 >> 1)) {
      iVar8 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (&items.super_SmallVectorBase<const_slang::ast::Expression_*>,
                         (EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src);
      __begin2.list = (ParentList *)CONCAT44(extraout_var_00,iVar8);
      args = (UniquenessConstraint *)&__begin2;
      ctrl = BumpAllocator::
             emplace<slang::ast::UniquenessConstraint,std::span<slang::ast::Expression_const*,18446744073709551615ul>>
                       (&compilation->super_BumpAllocator,
                        (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)args);
      if (bVar5) {
        args = ctrl;
        ctrl = (UniquenessConstraint *)
               Constraint::badConstraint(compilation,&ctrl->super_Constraint);
      }
      SmallVectorBase<const_slang::ast::Expression_*>::cleanup
                (&items.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)args);
      return &ctrl->super_Constraint;
    }
    pEVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
              iterator_base<slang::syntax::ExpressionSyntax_*>::dereference(&__begin2);
    iVar8 = Expression::bind((int)pEVar10,(sockaddr *)context,0);
    this = (Expression *)CONCAT44(extraout_var,iVar8);
    local_78 = this;
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)&items,&local_78);
    bVar7 = Expression::bad(this);
    pTVar6 = local_a8;
    if (bVar7) {
      bVar5 = true;
      src = extraout_RDX;
    }
    else {
      this_00 = Expression::getSymbolReference(this,true);
      if (this_00 == (Symbol *)0x0) {
        ASTContext::addDiag(context,(DiagCode)0x290008,this->sourceRange);
        bVar5 = true;
        src = extraout_RDX_05;
      }
      else {
        pDVar11 = Symbol::getDeclaredType(this_00);
        pTVar12 = DeclaredType::getType(pDVar11);
        while ((bVar7 = Type::isIntegral(pTVar12), !bVar7 &&
               (((int)LVar2 < 1 || (bVar7 = Type::isFloating(pTVar12), !bVar7))))) {
          bVar7 = Type::isUnpackedArray(pTVar12);
          if (!bVar7) {
            pDVar13 = ASTContext::addDiag(context,(DiagCode)0x60008,this->sourceRange);
            pDVar11 = Symbol::getDeclaredType(this_00);
            pTVar12 = DeclaredType::getType(pDVar11);
            ast::operator<<(pDVar13,pTVar12);
            bVar5 = true;
            src = extraout_RDX_06;
            goto LAB_002cb9d9;
          }
          pTVar12 = Type::getArrayElementType(pTVar12);
        }
        pDVar11 = Symbol::getDeclaredType(this_00);
        pTVar12 = DeclaredType::getType(pDVar11);
        while (bVar7 = Type::isUnpackedArray(pTVar12), bVar7) {
          pTVar12 = Type::getArrayElementType(pTVar12);
        }
        RVar9 = ASTContext::getRandMode(context,this_00);
        if (RVar9 == None) {
          code.subsystem = Statements;
          code.code = 0x29;
        }
        else {
          code.subsystem = Statements;
          code.code = 0x3b;
          if (RVar9 != RandC) {
            src = extraout_RDX_00;
            pTVar6 = pTVar12;
            if ((((local_a8 != (Type *)0x0) &&
                 (bVar7 = Type::isEquivalent(local_a8,pTVar12), src = extraout_RDX_01,
                 pTVar6 = local_a8, !bVar7)) && (!bVar5)) &&
               ((bVar7 = Type::isError(local_a8), src = extraout_RDX_02, !bVar7 &&
                (bVar7 = Type::isError(pTVar12), src = extraout_RDX_03, !bVar7)))) {
              pDVar13 = ASTContext::addDiag(context,(DiagCode)0x1e0008,this->sourceRange);
              pDVar13 = Diagnostic::operator<<(pDVar13,this_00->name);
              pDVar13 = ast::operator<<(pDVar13,pTVar12);
              ast::operator<<(pDVar13,local_a8);
              bVar5 = true;
              src = extraout_RDX_04;
            }
            goto LAB_002cb9d9;
          }
        }
        ASTContext::addDiag(context,code,this->sourceRange);
        src = extraout_RDX_07;
      }
    }
LAB_002cb9d9:
    local_a8 = pTVar6;
    __begin2.index = __begin2.index + 1;
  } while( true );
}

Assistant:

Constraint& UniquenessConstraint::fromSyntax(const UniquenessConstraintSyntax& syntax,
                                             const ASTContext& context) {
    auto& comp = context.getCompilation();
    const auto lv = comp.languageVersion();

    bool bad = false;
    const Type* commonType = nullptr;
    SmallVector<const Expression*> items;
    for (auto item : syntax.ranges->valueRanges) {
        auto& expr = Expression::bind(*item, context);
        items.push_back(&expr);

        if (expr.bad()) {
            bad = true;
        }
        else {
            auto sym = expr.getSymbolReference();
            if (!sym || !isAllowedForUniqueness(sym->getDeclaredType()->getType(), lv)) {
                if (!sym) {
                    context.addDiag(diag::InvalidUniquenessExpr, expr.sourceRange);
                }
                else {
                    context.addDiag(diag::BadUniquenessType, expr.sourceRange)
                        << sym->getDeclaredType()->getType();
                }
                bad = true;
            }
            else {
                const Type* symType = &sym->getDeclaredType()->getType();
                while (symType->isUnpackedArray())
                    symType = symType->getArrayElementType();

                RandMode mode = context.getRandMode(*sym);
                if (mode == RandMode::RandC)
                    context.addDiag(diag::RandCInUnique, expr.sourceRange);
                else if (mode == RandMode::None)
                    context.addDiag(diag::InvalidUniquenessExpr, expr.sourceRange);
                else if (!commonType)
                    commonType = symType;
                else if (!commonType->isEquivalent(*symType)) {
                    // All variables used in a uniqueness constraint must have equivalent types.
                    if (!bad && !commonType->isError() && !symType->isError()) {
                        auto& diag = context.addDiag(diag::InequivalentUniquenessTypes,
                                                     expr.sourceRange);
                        diag << sym->name << *symType << *commonType;
                        bad = true;
                    }
                }
            }
        }
    }

    auto result = comp.emplace<UniquenessConstraint>(items.copy(comp));
    if (bad)
        return badConstraint(comp, result);

    return *result;
}